

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O0

int socket_bytes_available(int socket)

{
  int iVar1;
  int local_14;
  int local_10;
  int n;
  int socket_local;
  
  local_14 = 0;
  local_10 = socket;
  iVar1 = ioctl(socket,0x541b,&local_14);
  if (iVar1 < 0) {
    n = -1;
  }
  else {
    n = local_14;
  }
  return n;
}

Assistant:

int socket_bytes_available(int socket)
{
#ifdef _WIN32
    u_long n = 0;
    if (ioctlsocket(socket, FIONREAD, &n) != NO_ERROR)
        return -1;
    return n;
#else
    int n = 0;
    if (ioctl(socket, FIONREAD, &n) < 0)
        return -1;
    return n;
#endif
}